

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AY38910.hpp
# Opt level: O2

void __thiscall GI::AY38910::State::State(State *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<GI::AY38910::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058f290;
  this->registers[0] = '\0';
  this->registers[1] = '\0';
  this->registers[2] = '\0';
  this->registers[3] = '\0';
  this->registers[4] = '\0';
  this->registers[5] = '\0';
  this->registers[6] = '\0';
  this->registers[7] = '\0';
  this->registers[8] = '\0';
  this->registers[9] = '\0';
  this->registers[10] = '\0';
  this->registers[0xb] = '\0';
  this->registers[0xc] = '\0';
  this->registers[0xd] = '\0';
  this->registers[0xe] = '\0';
  this->registers[0xf] = '\0';
  this->selected_register = '\0';
  if (Reflection::StructImpl<GI::AY38910::State>::contents__abi_cxx11_._M_h._M_element_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"registers",&local_29);
    Reflection::StructImpl<GI::AY38910::State>::declare<unsigned_char[16]>
              (&this->super_StructImpl<GI::AY38910::State>,&this->registers,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"selected_register",&local_29);
    Reflection::StructImpl<GI::AY38910::State>::declare<unsigned_char>
              (&this->super_StructImpl<GI::AY38910::State>,&this->selected_register,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(registers);
			DeclareField(selected_register);
		}
	}